

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O2

char * __thiscall TadsHttpRequestHeader::find(TadsHttpRequestHeader *this,char *name)

{
  int iVar1;
  TadsHttpRequestHeader *h;
  
  while( true ) {
    if (this == (TadsHttpRequestHeader *)0x0) {
      return (char *)0x0;
    }
    iVar1 = stricmp(this->name,name);
    if (iVar1 == 0) break;
    this = this->nxt;
  }
  return this->value;
}

Assistant:

const char *find(const char *name)
    {
        /* scan the list, starting with this element */
        for (TadsHttpRequestHeader *h = this ; h != 0 ; h = h->nxt)
        {
            /* if this name matches, return the value */
            if (stricmp(h->name, name) == 0)
                return h->value;
        }
        
        /* didn't find a match */
        return 0;
    }